

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack8to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,int kernel_w,int kernel_h,int dilation_w,
               int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long *plVar1;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int j;
  int i;
  int64_t *sptr;
  int v;
  int u;
  int64_t *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Option *in_stack_00000ff0;
  Mat *in_stack_00000ff8;
  Mat *in_stack_00001000;
  Mat *in_stack_00001008;
  undefined8 in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  int local_150;
  int in_stack_fffffffffffffeb4;
  int iVar2;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int iVar3;
  int in_stack_fffffffffffffec4;
  Mat *in_stack_fffffffffffffec8;
  Allocator *in_stack_fffffffffffffed0;
  long *local_f0;
  Mat local_d8;
  int local_90;
  int local_8c;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RDI + 0x38);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = local_30 * local_34;
  local_3c = in_ECX * in_R8D;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
           in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
           (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),in_stack_fffffffffffffed0);
  local_8c = local_28 * j - local_30 * in_stack_00000010;
  for (local_90 = 0; local_90 < local_2c; local_90 = local_90 + 1) {
    Mat::channel(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    Mat::channel(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    local_f0 = Mat::operator_cast_to_long_((Mat *)&stack0xfffffffffffffec8);
    Mat::~Mat((Mat *)0x2a68ad);
    for (in_stack_fffffffffffffec4 = 0; in_stack_fffffffffffffec4 < local_20;
        in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
      for (iVar3 = 0; iVar3 < local_1c; iVar3 = iVar3 + 1) {
        plVar1 = Mat::row<long_const>(&local_d8,in_stack_00000008 * in_stack_fffffffffffffec4);
        plVar1 = plVar1 + local_24 * iVar3;
        for (iVar2 = 0; iVar2 < local_34; iVar2 = iVar2 + 1) {
          for (local_150 = 0; local_150 < local_30; local_150 = local_150 + 1) {
            *local_f0 = *plVar1;
            plVar1 = plVar1 + in_stack_00000010;
            local_f0 = local_f0 + 1;
          }
          plVar1 = plVar1 + local_8c;
        }
      }
    }
    Mat::~Mat((Mat *)0x2a6a3e);
  }
  im2col_sgemm_pack8to4_int8_sse
            (in_stack_00001008,in_stack_00001000,in_stack_00000ff8,in_stack_00000ff0);
  Mat::~Mat((Mat *)0x2a6a88);
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);
    {
        const int gap = w * stride_h - outw * stride_w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            int64_t* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const int64_t* sptr = img.row<const int64_t>(dilation_h * u) + dilation_w * v;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            ptr[0] = sptr[0];

                            sptr += stride_w;
                            ptr += 1;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}